

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O2

long arti_cost(obj *otmp)

{
  if ((long)otmp->oartifact == 0) {
    return (long)objects[otmp->otyp].oc_cost;
  }
  if (artilist[otmp->oartifact].cost != 0) {
    return artilist[otmp->oartifact].cost;
  }
  return (long)objects[otmp->otyp].oc_cost * 100;
}

Assistant:

long arti_cost(const struct obj *otmp)
{
	if (!otmp->oartifact)
	    return (long)objects[otmp->otyp].oc_cost;
	else if (artilist[(int) otmp->oartifact].cost)
	    return artilist[(int) otmp->oartifact].cost;
	else
	    return 100L * (long)objects[otmp->otyp].oc_cost;
}